

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::CDEFBlockHighbdTest_TestSIMDHighbdNoMismatch_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::CDEFBlockHighbdTest_TestSIMDHighbdNoMismatch_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<std::array<void(*)(void*,int,unsigned_short_const*,int,int,int,int,int,int,int,int),4ul>,std::array<void(*)(void*,int,unsigned_short_const*,int,int,int,int,int,int,int,int),4ul>,BLOCK_SIZE,int,int>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x68);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_010390b0;
  this_00[1]._vptr_Test =
       (_func_int **)&PTR__CDEFBlockHighbdTest_TestSIMDHighbdNoMismatch_Test_010390f0;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }